

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

bool __thiscall
QDirSortItemComparator::operator()(QDirSortItemComparator *this,QDirSortItem *n1,QDirSortItem *n2)

{
  uint uVar1;
  Data DVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  qint64 qVar8;
  qint64 qVar9;
  CaseSensitivity cs;
  uint uVar10;
  long in_FS_OFFSET;
  QDateTime firstModified;
  QDateTime secondModified;
  Data local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  Data local_48;
  Data local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->qt_cmp_si_sort_flags).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
       super_QFlagsStorage<QDir::SortFlag>.i & 4) != 0) {
    bVar5 = QFileInfo::isDir(&n1->item);
    bVar6 = QFileInfo::isDir(&n2->item);
    if (bVar5 != bVar6) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        bVar5 = QFileInfo::isDir(&n1->item);
        return bVar5;
      }
      goto LAB_00225fc0;
    }
  }
  if (((this->qt_cmp_si_sort_flags).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
       super_QFlagsStorage<QDir::SortFlag>.i & 0x20) == 0) {
LAB_00225d40:
    uVar1 = (this->qt_cmp_si_sort_flags).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
            super_QFlagsStorage<QDir::SortFlag>.i;
    uVar10 = uVar1 & 0x83;
    cs = (CaseSensitivity)((uVar1 & 0x10) == 0);
    if (uVar10 == 0x80) {
      iVar7 = compareStrings(this,&n1->suffix_cache,&n2->suffix_cache,cs);
      qVar8 = (qint64)iVar7;
    }
    else if (uVar10 == 2) {
      qVar8 = QFileInfo::size(&n2->item);
      qVar9 = QFileInfo::size(&n1->item);
      qVar8 = qVar8 - qVar9;
    }
    else if (uVar10 == 1) {
      local_68.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = (Data)0x2;
      QFileInfo::fileTime((QFileInfo *)&local_68.data,(int)n1 + 0x30,(QTimeZone *)0x3);
      QTimeZone::~QTimeZone((QTimeZone *)&local_40.s);
      local_40.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = (Data)0x2;
      QFileInfo::fileTime((QFileInfo *)&local_40.s,(int)n2 + 0x30,(QTimeZone *)0x3);
      QTimeZone::~QTimeZone((QTimeZone *)&local_48.s);
      qVar8 = QDateTime::msecsTo((QDateTime *)&local_68.data,(QDateTime *)&local_40.s);
      QDateTime::~QDateTime((QDateTime *)&local_40.s);
      QDateTime::~QDateTime((QDateTime *)&local_68.data);
    }
    else {
      qVar8 = 0;
    }
    if ((uVar10 != 3) && (qVar8 == 0)) {
      if ((n1->filename_cache).d.ptr == (char16_t *)0x0) {
        QFileInfo::fileName((QString *)&local_68.data,&n1->item);
        DVar2.data = (ShortData)(n1->filename_cache).d.d;
        pcVar3 = (n1->filename_cache).d.ptr;
        (n1->filename_cache).d.d = (Data *)local_68;
        (n1->filename_cache).d.ptr = pcStack_60;
        qVar4 = (n1->filename_cache).d.size;
        (n1->filename_cache).d.size = local_58;
        local_68.data = DVar2.data;
        pcStack_60 = pcVar3;
        local_58 = qVar4;
        if (DVar2.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(DVar2.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
          _M_i = (((QBasicAtomicInt *)&(DVar2.d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(DVar2.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)DVar2.d,2,0x10);
          }
        }
      }
      if ((n2->filename_cache).d.ptr == (char16_t *)0x0) {
        QFileInfo::fileName((QString *)&local_68.data,&n2->item);
        DVar2.data = (ShortData)(n2->filename_cache).d.d;
        pcVar3 = (n2->filename_cache).d.ptr;
        (n2->filename_cache).d.d = (Data *)local_68;
        (n2->filename_cache).d.ptr = pcStack_60;
        qVar4 = (n2->filename_cache).d.size;
        (n2->filename_cache).d.size = local_58;
        local_68.data = DVar2.data;
        pcStack_60 = pcVar3;
        local_58 = qVar4;
        if (DVar2.d != (QDateTimePrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(DVar2.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
          _M_i = (((QBasicAtomicInt *)&(DVar2.d)->super_QSharedData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(DVar2.d)->super_QSharedData)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)DVar2.d,2,0x10);
          }
        }
      }
      iVar7 = compareStrings(this,&n1->filename_cache,&n2->filename_cache,cs);
      qVar8 = (qint64)iVar7;
    }
    bVar5 = 0 < qVar8;
    if (((this->qt_cmp_si_sort_flags).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
         super_QFlagsStorage<QDir::SortFlag>.i & 8) == 0) {
      bVar5 = qVar8 < 0;
    }
  }
  else {
    bVar5 = QFileInfo::isDir(&n1->item);
    bVar6 = QFileInfo::isDir(&n2->item);
    if (bVar5 == bVar6) goto LAB_00225d40;
    bVar5 = QFileInfo::isDir(&n1->item);
    bVar5 = !bVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
LAB_00225fc0:
  __stack_chk_fail();
}

Assistant:

bool QDirSortItemComparator::operator()(const QDirSortItem &n1, const QDirSortItem &n2) const
{
    const QDirSortItem* f1 = &n1;
    const QDirSortItem* f2 = &n2;

    if ((qt_cmp_si_sort_flags & QDir::DirsFirst) && (f1->item.isDir() != f2->item.isDir()))
        return f1->item.isDir();
    if ((qt_cmp_si_sort_flags & QDir::DirsLast) && (f1->item.isDir() != f2->item.isDir()))
        return !f1->item.isDir();

    const bool ic = qt_cmp_si_sort_flags.testAnyFlag(QDir::IgnoreCase);
    const auto qtcase = ic ? Qt::CaseInsensitive : Qt::CaseSensitive;

    qint64 r = 0;
    int sortBy = ((qt_cmp_si_sort_flags & QDir::SortByMask)
                 | (qt_cmp_si_sort_flags & QDir::Type)).toInt();

    switch (sortBy) {
      case QDir::Time: {
        const QDateTime firstModified = f1->item.lastModified(QTimeZone::UTC);
        const QDateTime secondModified = f2->item.lastModified(QTimeZone::UTC);
        r = firstModified.msecsTo(secondModified);
        break;
      }
      case QDir::Size:
          r = f2->item.size() - f1->item.size();
        break;
    case QDir::Type:
        r = compareStrings(f1->suffix_cache, f2->suffix_cache, qtcase);
        break;
      default:
        ;
    }

    if (r == 0 && sortBy != QDir::Unsorted) {
        // Still not sorted - sort by name

        if (f1->filename_cache.isNull())
            f1->filename_cache = f1->item.fileName();
        if (f2->filename_cache.isNull())
            f2->filename_cache = f2->item.fileName();

        r = compareStrings(f1->filename_cache, f2->filename_cache, qtcase);
    }
    if (qt_cmp_si_sort_flags & QDir::Reversed)
        return r > 0;
    return r < 0;
}